

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# questpgr.c
# Opt level: O3

void unload_qtlist(void)

{
  if (msg_file != (dlb *)0x0) {
    dlb_fclose(msg_file);
    msg_file = (dlb *)0x0;
  }
  if (qt_list_0 != (void *)0x0) {
    free(qt_list_0);
    qt_list_0 = (void *)0x0;
  }
  if (qt_list_1 != (void *)0x0) {
    free(qt_list_1);
    qt_list_1 = (void *)0x0;
  }
  return;
}

Assistant:

void unload_qtlist(void)
{
	if (msg_file)
	    dlb_fclose(msg_file),  msg_file = 0;
	if (qt_list.common)
	    free(qt_list.common),  qt_list.common = 0;
	if (qt_list.chrole)
	    free(qt_list.chrole),  qt_list.chrole = 0;
	return;
}